

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Enterprise.cpp
# Opt level: O0

void __thiscall
Enterprise::ConcreteMachine<false,false>::type_string(ConcreteMachine<false,false> *this)

{
  string *in_RSI;
  
  ConcreteMachine<false,_false>::type_string((ConcreteMachine<false,_false> *)(this + -0x28),in_RSI)
  ;
  return;
}

Assistant:

void type_string(const std::string &string) final {
			Utility::TypeRecipient<CharacterMapper>::add_typer(string);

			if(z80_.get_is_resetting()) {
				should_skip_splash_screen_ = true;
				typer_delay_ = 1;
			} else {
				should_skip_splash_screen_ = false;
				typer_delay_ = 0;
			}
		}